

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleLeggedOdometry.cpp
# Opt level: O0

bool __thiscall
iDynTree::SimpleLeggedOdometry::updateKinematics
          (SimpleLeggedOdometry *this,JointPosDoubleArray *jointPos)

{
  byte bVar1;
  ulong uVar2;
  Model *in_RSI;
  Model *in_RDI;
  bool ok;
  Transform local_80 [104];
  Model *local_18;
  Model local_1;
  
  if (((byte)in_RDI[400] & 1) == 0) {
    iDynTree::reportError("SimpleLeggedOdometry","updateKinematics","model not valid");
    local_1 = (Model)0x0;
  }
  else {
    local_18 = in_RSI;
    uVar2 = iDynTree::JointPosDoubleArray::isConsistent(in_RSI);
    if ((uVar2 & 1) == 0) {
      iDynTree::reportError
                ("SimpleLeggedOdometry","updateKinematics","error in size of input jointPos");
      local_1 = (Model)0x0;
    }
    else {
      iDynTree::Transform::Identity();
      bVar1 = iDynTree::ForwardPositionKinematics
                        (in_RDI,(Traversal *)(in_RDI + 0x130),local_80,(VectorDynSize *)local_18,
                         (LinkPositions *)(in_RDI + 0x1a0));
      local_1 = (Model)(bVar1 & 1);
      in_RDI[0x191] = local_1;
    }
  }
  return (bool)local_1;
}

Assistant:

bool SimpleLeggedOdometry::updateKinematics(JointPosDoubleArray& jointPos)
{
    if( !m_isModelValid )
    {
        reportError("SimpleLeggedOdometry",
                    "updateKinematics","model not valid");
        return false;
    }

    if( !jointPos.isConsistent(m_model) )
    {
        reportError("SimpleLeggedOdometry",
                    "updateKinematics","error in size of input jointPos");
        return false;
    }

    bool ok = ForwardPositionKinematics(m_model,m_traversal,
                                        Transform::Identity(),jointPos,
                                        m_base_H_link);

    m_kinematicsUpdated = ok;

    return ok;
}